

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

VisitReturn __thiscall
QMakeEvaluator::visitProVariable
          (QMakeEvaluator *this,ushort tok,ProStringList *curr,ushort **tokPtr)

{
  undefined1 *puVar1;
  int iVar2;
  ushort *puVar3;
  int *piVar4;
  Data *pDVar5;
  Data *pDVar6;
  VisitReturn VVar7;
  CutResult CVar8;
  ProString *pPVar9;
  pointer pQVar10;
  qsizetype qVar11;
  QArrayDataPointer<ProString> *this_00;
  iterator this_01;
  ProStringList *pPVar12;
  char16_t *pcVar13;
  char *fmt;
  QArrayData *pQVar14;
  uint sizeHint;
  ProString *pPVar15;
  long in_FS_OFFSET;
  bool global;
  bool bVar16;
  bool bVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QStringView QVar20;
  QByteArrayView QVar21;
  QStringView QVar22;
  QRegularExpression regexp;
  ProString local_198;
  QString local_168;
  QArrayData *local_150;
  undefined8 *local_148;
  ProString local_138;
  QString local_100;
  QArrayData *local_e8;
  undefined8 *local_e0;
  undefined1 *local_d0;
  QString local_c8;
  QString local_a8;
  QArrayDataPointer<ProString> local_88;
  QArrayData *local_68;
  char16_t *pcStack_60;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = *tokPtr;
  *tokPtr = puVar3 + 1;
  if ((curr->super_QList<ProString>).d.size == 1) {
    sizeHint = (uint)*puVar3;
    pPVar9 = &map(this,(ProKey *)(curr->super_QList<ProString>).d.ptr)->super_ProString;
    if (tok == 6) {
      local_58.d = (Data *)0x0;
      local_58.ptr = (ProString *)0x0;
      local_58.size = 0;
      VVar7 = expandVariableReferences(this,tokPtr,sizeHint,(ProStringList *)&local_58,true);
      if (VVar7 != ReturnError) {
        local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_60 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        pcVar13 = ((local_58.ptr)->m_string).d.ptr;
        local_138.m_string.d.d = (Data *)(long)(local_58.ptr)->m_offset;
        local_198.m_string.d.d = (Data *)(long)(local_58.ptr)->m_length;
        CVar8 = QtPrivate::QContainerImplHelper::mid
                          (((local_58.ptr)->m_string).d.size,(qsizetype *)&local_138,
                           (qsizetype *)&local_198);
        if (CVar8 == Null) {
          local_68 = (QArrayData *)0x0;
          pcStack_60 = (char16_t *)0x0;
        }
        else {
          pcStack_60 = pcVar13 + (long)local_138.m_string.d.d;
          local_68 = &(local_198.m_string.d.d)->super_QArrayData;
        }
        if ((3 < (long)local_68) && (*pcStack_60 == L's')) {
          local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d._0_4_ = 0xaaaaaaaa;
          local_88.d._4_4_ = 0xaaaaaaaa;
          local_88.ptr._0_4_ = 0xaaaaaaaa;
          local_88.ptr._4_4_ = 0xaaaaaaaa;
          bVar16 = true;
          QStringView::split(&local_88,&local_68,pcStack_60[1],0,1);
          puVar1 = (undefined1 *)(local_88.size + -3);
          if (puVar1 < (undefined1 *)0x2) {
            if ((undefined1 *)local_88.size == (undefined1 *)0x4) {
              pQVar10 = QList<QStringView>::data((QList<QStringView> *)&local_88);
              qVar11 = QStringView::indexOf(pQVar10 + 3,(QChar)0x67,0,CaseSensitive);
              global = qVar11 != -1;
              pQVar10 = QList<QStringView>::data((QList<QStringView> *)&local_88);
              qVar11 = QStringView::indexOf(pQVar10 + 3,(QChar)0x69,0,CaseSensitive);
              bVar16 = qVar11 != -1;
              pQVar10 = QList<QStringView>::data((QList<QStringView> *)&local_88);
              qVar11 = QStringView::indexOf(pQVar10 + 3,(QChar)0x71,0,CaseSensitive);
              bVar17 = qVar11 != -1;
            }
            else {
              global = false;
              bVar17 = false;
            }
            local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar10 = QList<QStringView>::data((QList<QStringView> *)&local_88);
            QString::QString(&local_a8,(QChar *)pQVar10[1].m_data,pQVar10[1].m_size);
            local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar10 = QList<QStringView>::data((QList<QStringView> *)&local_88);
            QString::QString(&local_c8,(QChar *)pQVar10[2].m_data,pQVar10[2].m_size);
            if (bVar17) {
              QVar22.m_data = (storage_type_conflict *)local_a8.d.size;
              QVar22.m_size = (qsizetype)&local_138;
              QRegularExpression::escape(QVar22);
              pcVar13 = local_a8.d.ptr;
              pDVar6 = local_a8.d.d;
              qVar11 = local_138.m_string.d.size;
              pDVar5 = local_138.m_string.d.d;
              local_138.m_string.d.d = local_a8.d.d;
              local_a8.d.d = pDVar5;
              local_a8.d.ptr = local_138.m_string.d.ptr;
              local_138.m_string.d.ptr = pcVar13;
              local_138.m_string.d.size = local_a8.d.size;
              local_a8.d.size = qVar11;
              if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                }
              }
            }
            local_d0 = &DAT_aaaaaaaaaaaaaaaa;
            QRegularExpression::QRegularExpression((QRegularExpression *)&local_d0,&local_a8,bVar16)
            ;
            pPVar12 = valuesRef(this,(ProKey *)pPVar9);
            replaceInList(pPVar12,(QRegularExpression *)&local_d0,&local_c8,global,&this->m_tmp2);
            if (this->m_debugLevel != 0) {
              ProString::ProString(&local_138,&local_a8);
              formatValue(&local_100,&local_138,true);
              QString::toLocal8Bit_helper((QChar *)&local_e8,(longlong)local_100.d.ptr);
              if (local_e0 == (undefined8 *)0x0) {
                local_e0 = &QByteArray::_empty;
              }
              ProString::ProString(&local_198,&local_c8);
              formatValue(&local_168,&local_198,true);
              QString::toLocal8Bit_helper((QChar *)&local_150,(longlong)local_168.d.ptr);
              if (local_148 == (undefined8 *)0x0) {
                local_148 = &QByteArray::_empty;
              }
              debugMsgInternal(this,2,"replaced %s with %s",local_e0,local_148);
              if (local_150 != (QArrayData *)0x0) {
                LOCK();
                (local_150->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_150->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_150->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_150,1,0x10);
                }
              }
              if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_198.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_198.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (local_e8 != (QArrayData *)0x0) {
                LOCK();
                (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_e8,1,0x10);
                }
              }
              if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            QRegularExpression::~QRegularExpression((QRegularExpression *)&local_d0);
            if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              iVar2 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              ;
              UNLOCK();
              pQVar14 = &(local_a8.d.d)->super_QArrayData;
joined_r0x00280061:
              if (iVar2 == 0) {
                QArrayData::deallocate(pQVar14,2,0x10);
              }
            }
          }
          else {
            QVar21.m_data = (storage_type *)0x2b;
            QVar21.m_size = (qsizetype)&local_138;
            QString::fromLatin1(QVar21);
            message(this,0x310,&local_138.m_string);
            if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              iVar2 = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i;
              UNLOCK();
              pQVar14 = &(local_138.m_string.d.d)->super_QArrayData;
              goto joined_r0x00280061;
            }
          }
          piVar4 = (int *)CONCAT44(local_88.d._4_4_,local_88.d._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_88.d._4_4_,local_88.d._0_4_),0x10,0x10);
            }
          }
          QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
          VVar7 = ReturnTrue;
          if ((undefined1 *)0x1 < puVar1) goto LAB_0027fe46;
          goto LAB_0027fcbf;
        }
        QVar19.m_data = (storage_type *)0x32;
        QVar19.m_size = (qsizetype)&local_138;
        QString::fromLatin1(QVar19);
        message(this,0x310,&local_138.m_string);
        if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
        goto LAB_0027fe41;
      }
      pPVar9 = (ProString *)&local_58;
    }
    else {
      local_138.m_string.d.d = (Data *)0x0;
      local_138.m_string.d.ptr = (char16_t *)0x0;
      local_138.m_string.d.size = 0;
      VVar7 = expandVariableReferences(this,tokPtr,sizeHint,(ProStringList *)&local_138,false);
      if (VVar7 != ReturnError) {
        if (tok == 3) {
          ProStringList::removeEmpty((ProStringList *)&local_138);
          pPVar12 = valuesRef(this,(ProKey *)pPVar9);
          QtPrivate::QCommonArrayOps<ProString>::growAppend
                    ((QCommonArrayOps<ProString> *)pPVar12,(ProString *)local_138.m_string.d.ptr,
                     (ProString *)
                     ((long)local_138.m_string.d.ptr + local_138.m_string.d.size * 0x30));
          if (this->m_debugLevel != 0) {
            fmt = "appending";
            goto LAB_0027fca6;
          }
        }
        else if (tok == 4) {
          pPVar12 = valuesRef(this,(ProKey *)pPVar9);
          ProStringList::insertUnique(pPVar12,(ProStringList *)&local_138);
          if (this->m_debugLevel != 0) {
            fmt = "appending unique";
            goto LAB_0027fca6;
          }
        }
        else if (tok == 5) {
          pPVar12 = valuesRef(this,(ProKey *)pPVar9);
          ProStringList::removeEach(pPVar12,(ProStringList *)&local_138);
          if (this->m_debugLevel != 0) {
            fmt = "removing";
LAB_0027fca6:
            debugMsgInternal(this,2,fmt);
          }
        }
        else {
          ProStringList::removeEmpty((ProStringList *)&local_138);
          this_00 = (QArrayDataPointer<ProString> *)
                    QMap<ProKey,_ProStringList>::operator[]
                              ((QMap<ProKey,_ProStringList> *)
                               ((this->m_valuemapStack).
                                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                                .
                                super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),(ProKey *)pPVar9
                              );
          QArrayDataPointer<ProString>::operator=
                    (this_00,(QArrayDataPointer<ProString> *)&local_138);
          if (this->m_debugLevel != 0) {
            fmt = "assigning";
            goto LAB_0027fca6;
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_138)
        ;
LAB_0027fcbf:
        if (this->m_debugLevel != 0) {
          local_138.m_string.d.d = (Data *)(long)pPVar9->m_offset;
          local_198.m_string.d.d = (Data *)(long)pPVar9->m_length;
          CVar8 = QtPrivate::QContainerImplHelper::mid
                            ((pPVar9->m_string).d.size,(qsizetype *)&local_138,
                             (qsizetype *)&local_198);
          pQVar14 = &(local_198.m_string.d.d)->super_QArrayData;
          if (CVar8 == Null) {
            pQVar14 = (QArrayData *)0x0;
          }
          QVar20.m_data = (storage_type_conflict *)pQVar14;
          QVar20.m_size = (qsizetype)&local_138;
          QtPrivate::convertToLocal8Bit(QVar20);
          pPVar15 = (ProString *)local_138.m_string.d.ptr;
          if ((ProString *)local_138.m_string.d.ptr == (ProString *)0x0) {
            pPVar15 = (ProString *)&QByteArray::_empty;
          }
          values((ProStringList *)&local_88,this,(ProKey *)pPVar9);
          formatValueList((QString *)&local_58,(ProStringList *)&local_88,false);
          QString::toLocal8Bit_helper((QChar *)&local_198,(longlong)local_58.ptr);
          pcVar13 = local_198.m_string.d.ptr;
          if (local_198.m_string.d.ptr == (char16_t *)0x0) {
            pcVar13 = (char16_t *)&QByteArray::_empty;
          }
          traceMsgInternal(this,"%s := %s",pPVar15,pcVar13);
          if (&(local_198.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_198.m_string.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
            }
          }
          QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
          if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        bVar16 = ProString::operator==(pPVar9,(ProString *)(QMakeInternal::statics + 0x150));
        if (bVar16) {
          setTemplate(this);
        }
        else {
          bVar16 = ProString::operator==(pPVar9,(ProString *)(QMakeInternal::statics + 0x180));
          if (!bVar16) {
            bVar16 = ProString::operator==(pPVar9,(ProString *)(QMakeInternal::statics + 0x1b0));
            if (!bVar16) {
              bVar16 = ProString::operator==(pPVar9,(ProString *)(QMakeInternal::statics + 0x1e0));
              if (bVar16) {
                values((ProStringList *)&local_138,this,(ProKey *)pPVar9);
                qVar11 = local_138.m_string.d.size;
                QArrayDataPointer<ProString>::~QArrayDataPointer
                          ((QArrayDataPointer<ProString> *)&local_138);
                VVar7 = ReturnTrue;
                if ((storage_type_conflict *)qVar11 != (storage_type_conflict *)0x0) {
                  local_138.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_138.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_138.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  values((ProStringList *)&local_198,this,(ProKey *)pPVar9);
                  this_01 = QList<ProString>::begin(&local_198);
                  ProString::toQString(&local_138.m_string,this_01.i);
                  QArrayDataPointer<ProString>::~QArrayDataPointer
                            ((QArrayDataPointer<ProString> *)&local_198);
                  bVar16 = QMakeInternal::IoUtils::isRelativePath(&local_138.m_string);
                  if (!bVar16) {
                    QString::operator=(&this->m_qmakespec,(QString *)&local_138);
                    QVar22 = QMakeInternal::IoUtils::fileName(&this->m_qmakespec);
                    QString::QString(&local_198.m_string,(QChar *)QVar22.m_data,QVar22.m_size);
                    pQVar14 = &((this->m_qmakespecName).d.d)->super_QArrayData;
                    pcVar13 = (this->m_qmakespecName).d.ptr;
                    (this->m_qmakespecName).d.d = local_198.m_string.d.d;
                    (this->m_qmakespecName).d.ptr = local_198.m_string.d.ptr;
                    qVar11 = (this->m_qmakespecName).d.size;
                    (this->m_qmakespecName).d.size = local_198.m_string.d.size;
                    local_198.m_string.d.d = (Data *)pQVar14;
                    local_198.m_string.d.ptr = pcVar13;
                    local_198.m_string.d.size = qVar11;
                    if (pQVar14 != (QArrayData *)0x0) {
                      LOCK();
                      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
                           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(pQVar14,2,0x10);
                      }
                    }
                    QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
                              (&this->m_featureRoots,(QMakeFeatureRoots *)0x0);
                  }
                  if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
              }
              else {
                bVar16 = ProString::operator==(pPVar9,(ProString *)(QMakeInternal::statics + 0x210))
                ;
                VVar7 = ReturnTrue;
                if (bVar16) {
                  values((ProStringList *)&local_138,this,(ProKey *)pPVar9);
                  VVar7 = checkRequirements(this,(ProStringList *)&local_138);
                  QArrayDataPointer<ProString>::~QArrayDataPointer
                            ((QArrayDataPointer<ProString> *)&local_138);
                }
              }
              goto LAB_0027fe46;
            }
            first(&local_138,this,(ProKey *)pPVar9);
            QString::operator=(&(this->m_dirSep).m_string,(QString *)&local_138);
            (this->m_dirSep).m_hash = local_138.m_hash;
            (this->m_dirSep).m_offset = local_138.m_offset;
            (this->m_dirSep).m_length = local_138.m_length;
            (this->m_dirSep).m_file = local_138.m_file;
            *(undefined4 *)&(this->m_dirSep).field_0x24 = local_138._36_4_;
            goto LAB_0027f995;
          }
          QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
                    (&this->m_featureRoots,(QMakeFeatureRoots *)0x0);
        }
        goto LAB_0027fe41;
      }
      pPVar9 = &local_138;
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)pPVar9);
    VVar7 = ReturnError;
  }
  else {
    skipExpression(this,tokPtr);
    QVar18.m_data = (storage_type *)0x3d;
    QVar18.m_size = (qsizetype)&local_138;
    QString::fromLatin1(QVar18);
    message(this,0x310,&local_138.m_string);
LAB_0027f995:
    if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_0027fe41:
    VVar7 = ReturnTrue;
  }
LAB_0027fe46:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar7;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProVariable(
        ushort tok, const ProStringList &curr, const ushort *&tokPtr)
{
    int sizeHint = *tokPtr++;

    if (curr.size() != 1) {
        skipExpression(tokPtr);
        if (!m_cumulative || !curr.isEmpty())
            evalError(fL1S("Left hand side of assignment must expand to exactly one word."));
        return ReturnTrue;
    }
    const ProKey &varName = map(curr.first());

    if (tok == TokReplace) {      // ~=
        // DEFINES ~= s/a/b/?[gqi]

        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, true) == ReturnError)
            return ReturnError;
        QStringView val = varVal.at(0).toQStringView();
        if (val.size() < 4 || val.at(0) != QLatin1Char('s')) {
            evalError(fL1S("The ~= operator can handle only the s/// function."));
            return ReturnTrue;
        }
        QChar sep = val.at(1);
        auto func = val.split(sep, Qt::KeepEmptyParts);
        if (func.size() < 3 || func.size() > 4) {
            evalError(fL1S("The s/// function expects 3 or 4 arguments."));
            return ReturnTrue;
        }

        bool global = false, quote = false, case_sense = false;
        if (func.size() == 4) {
            global = func[3].indexOf(QLatin1Char('g')) != -1;
            case_sense = func[3].indexOf(QLatin1Char('i')) == -1;
            quote = func[3].indexOf(QLatin1Char('q')) != -1;
        }
        QString pattern = func[1].toString();
        QString replace = func[2].toString();
        if (quote)
            pattern = QRegularExpression::escape(pattern);

        QRegularExpression regexp(pattern, case_sense ? QRegularExpression::NoPatternOption :
                                                        QRegularExpression::CaseInsensitiveOption);

        // We could make a union of modified and unmodified values,
        // but this will break just as much as it fixes, so leave it as is.
        replaceInList(&valuesRef(varName), regexp, replace, global, m_tmp2);
        debugMsg(2, "replaced %s with %s", dbgQStr(pattern), dbgQStr(replace));
    } else {
        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, false) == ReturnError)
            return ReturnError;
        switch (tok) {
        default: // whatever - cannot happen
        case TokAssign:          // =
            varVal.removeEmpty();
            // FIXME: add check+warning about accidental value removal.
            // This may be a bit too noisy, though.
            m_valuemapStack.top()[varName] = varVal;
            debugMsg(2, "assigning");
            break;
        case TokAppendUnique:    // *=
            valuesRef(varName).insertUnique(varVal);
            debugMsg(2, "appending unique");
            break;
        case TokAppend:          // +=
            varVal.removeEmpty();
            valuesRef(varName) += varVal;
            debugMsg(2, "appending");
            break;
        case TokRemove:       // -=
            if (!m_cumulative) {
                valuesRef(varName).removeEach(varVal);
            } else {
                // We are stingy with our values.
            }
            debugMsg(2, "removing");
            break;
        }
    }
    traceMsg("%s := %s", dbgKey(varName), dbgStrList(values(varName)));

    if (varName == statics.strTEMPLATE)
        setTemplate();
    else if (varName == statics.strQMAKE_PLATFORM)
        m_featureRoots = nullptr;
    else if (varName == statics.strQMAKE_DIR_SEP)
        m_dirSep = first(varName);
    else if (varName == statics.strQMAKESPEC) {
        if (!values(varName).isEmpty()) {
            QString spec = values(varName).first().toQString();
            if (IoUtils::isAbsolutePath(spec)) {
                m_qmakespec = spec;
                m_qmakespecName = IoUtils::fileName(m_qmakespec).toString();
                m_featureRoots = nullptr;
            }
        }
    }
#ifdef PROEVALUATOR_FULL
    else if (varName == statics.strREQUIRES)
        return checkRequirements(values(varName));
#endif

    return ReturnTrue;
}